

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O2

uint32_t ExUtilGetUInt(char *v,int base,int *error)

{
  uint32_t uVar1;
  char *pcVar3;
  char *end;
  char *local_28;
  ulong uVar2;
  
  local_28 = (char *)0x0;
  if (v == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar2 = strtoul(v,&local_28,base);
    uVar1 = (uint32_t)uVar2;
  }
  if (((error != (int *)0x0) && (local_28 == v)) && (*error == 0)) {
    *error = 1;
    pcVar3 = "(null)";
    if (v != (char *)0x0) {
      pcVar3 = v;
    }
    fprintf(stderr,"Error! \'%s\' is not an integer.\n",pcVar3);
  }
  return uVar1;
}

Assistant:

uint32_t ExUtilGetUInt(const char* const v, int base, int* const error) {
  char* end = NULL;
  const uint32_t n = (v != NULL) ? (uint32_t)strtoul(v, &end, base) : 0u;
  if (end == v && error != NULL && !*error) {
    *error = 1;
    fprintf(stderr, "Error! '%s' is not an integer.\n",
            (v != NULL) ? v : "(null)");
  }
  return n;
}